

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeRhs(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *newRhs,bool scale)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  pointer pnVar3;
  undefined7 in_register_00000011;
  long lVar4;
  ulong uVar5;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined1 local_94;
  undefined8 local_90;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  if ((int)CONCAT71(in_register_00000011,scale) != 0) {
    if (0 < (int)((ulong)((long)(this->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).right.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->
                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).right.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333) {
      lVar4 = 0x48;
      uVar5 = 0;
      do {
        pnVar3 = (newRhs->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -0x48);
        local_d8 = *puVar1;
        uStack_d4 = puVar1[1];
        uStack_d0 = puVar1[2];
        uStack_cc = puVar1[3];
        puVar1 = (undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -0x38);
        local_c8 = *puVar1;
        uStack_c4 = puVar1[1];
        uStack_c0 = puVar1[2];
        uStack_bc = puVar1[3];
        puVar1 = (undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -0x28);
        local_b8 = *puVar1;
        uStack_b4 = puVar1[1];
        uStack_b0 = puVar1[2];
        uStack_ac = puVar1[3];
        puVar1 = (undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -0x18);
        local_a8 = *puVar1;
        uStack_a4 = puVar1[1];
        uStack_a0 = puVar1[2];
        uStack_9c = puVar1[3];
        local_98 = *(undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -8);
        local_94 = *(undefined1 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -4);
        local_90 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar4);
        (*this->lp_scaler->_vptr_SPxScaler[0x2e])
                  (&local_80,this->lp_scaler,this,uVar5 & 0xffffffff,&local_d8);
        pnVar3 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -0x18);
        *puVar2 = local_50;
        puVar2[1] = uStack_48;
        puVar2 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -0x28);
        *puVar2 = local_60;
        puVar2[1] = uStack_58;
        puVar2 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -0x38);
        *puVar2 = local_70;
        puVar2[1] = uStack_68;
        puVar2 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -0x48);
        *puVar2 = local_80;
        puVar2[1] = uStack_78;
        *(undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -8) = local_40;
        *(undefined1 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -4) = local_3c;
        *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar4) = local_38;
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x50;
      } while ((long)uVar5 <
               (long)((int)((ulong)((long)(this->
                                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).right.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->
                                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).right.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x33333333));
    }
    return;
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right,newRhs);
  return;
}

Assistant:

virtual void changeRhs(const VectorBase<R>& newRhs, bool scale = false)
   {
      assert(rhs().dim() == newRhs.dim());

      if(scale)
      {
         assert(_isScaled);
         assert(lp_scaler);

         for(int i = 0; i < rhs().dim(); i++)
            LPRowSetBase<R>::rhs_w(i) = lp_scaler->scaleRhs(*this, i, newRhs[i]);
      }
      else
         LPRowSetBase<R>::rhs_w() = newRhs;

      assert(isConsistent());
   }